

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O3

void msd_A_register_hook(void)

{
  routine_register(&msd_A_routine);
  return;
}

Assistant:

void
msd_A_adaptive(unsigned char** strings, size_t N)
{
	cacheblock_t* cache = (cacheblock_t*) malloc(N*sizeof(cacheblock_t));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	fill_cache(cache, N, 0);
	msd_A_adaptive(cache, N, 0, 0);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}